

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODCodabarReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::OneD::CodabarReader::decodePattern
          (Barcode *__return_storage_ptr__,CodabarReader *this,int rowNumber,PatternView *next,
          unique_ptr<ZXing::OneD::RowReader::DecodingState,_std::default_delete<ZXing::OneD::RowReader::DecodingState>_>
          *param_3)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ushort *puVar2;
  int iVar3;
  Iterator puVar4;
  Iterator puVar5;
  ushort uVar6;
  long lVar7;
  float fVar8;
  uint local_bc;
  string txt;
  Error local_88;
  long *local_50 [2];
  long local_40 [2];
  
  FindLeftGuard<7,bool(*)(ZXing::PatternView_const&,int)>
            ((PatternView *)&txt,(ZXing *)next,(PatternView *)0x1c,0x15ba38,
             (_func_bool_PatternView_ptr_int *)param_3);
  *(undefined4 *)&next->_base = txt.field_2._M_allocated_capacity._0_4_;
  *(undefined4 *)((long)&next->_base + 4) = txt.field_2._M_allocated_capacity._4_4_;
  *(undefined4 *)&next->_end = txt.field_2._8_4_;
  *(undefined4 *)((long)&next->_end + 4) = txt.field_2._12_4_;
  next->_data = (Iterator)txt._M_dataplus._M_p;
  *(size_type *)&next->_size = txt._M_string_length;
  puVar4 = next->_data;
  puVar5 = next->_base;
  if ((puVar4 < puVar5 || puVar4 == (Iterator)0x0) || (next->_end < puVar4 + next->_size)) {
    memset(__return_storage_ptr__,0,0xd8);
    Result::Result(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  if (puVar5 == puVar4) {
    local_bc = 0;
  }
  else {
    uVar6 = 0;
    do {
      uVar6 = uVar6 + *puVar5;
      puVar5 = puVar5 + 1;
    } while (puVar5 != puVar4);
    local_bc = (uint)uVar6;
  }
  if ((long)next->_size == 0) {
    uVar6 = 0;
  }
  else {
    lVar7 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + *(short *)((long)puVar4 + lVar7);
      lVar7 = lVar7 + 2;
    } while ((long)next->_size * 2 != lVar7);
    uVar6 = uVar6 >> 1;
  }
  txt._M_dataplus._M_p = (pointer)&txt.field_2;
  txt._M_string_length = 0;
  txt.field_2._M_allocated_capacity._0_4_ = txt.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
  std::__cxx11::string::reserve((ulong)&txt);
  iVar3 = RowReader::NarrowWideBitPattern(next);
  RowReader::LookupBitPattern<int[20],char[21]>
            (iVar3,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
  std::__cxx11::string::push_back((char)&txt);
  if ((byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU) < 4) {
    do {
      if ((((next->_data == (Iterator)0x0) ||
           (puVar4 = next->_data + next->_size, next->_data = puVar4,
           next->_end < puVar4 + next->_size)) || (puVar2 = next->_data, puVar2 == (ushort *)0x0))
         || ((next->_data = puVar2 + 1, next->_end < puVar2 + (long)next->_size + 1 ||
             (uVar6 < *puVar2)))) goto LAB_0015bd03;
      iVar3 = RowReader::NarrowWideBitPattern(next);
      RowReader::LookupBitPattern<int[20],char[21]>
                (iVar3,(int (*) [20])CHARACTER_ENCODINGS,(char (*) [21])ALPHABET);
      std::__cxx11::string::push_back((char)&txt);
      if (txt._M_dataplus._M_p[txt._M_string_length - 1] == '\0') goto LAB_0015bd03;
    } while (3 < (byte)(txt._M_dataplus._M_p[txt._M_string_length - 1] + 0xbfU));
    if (3 < (int)txt._M_string_length) {
      iVar3 = next->_size;
      puVar2 = next->_data + iVar3;
      if (puVar2 != next->_end + -1) {
        if (iVar3 == 0) {
          fVar8 = 0.0;
        }
        else {
          lVar7 = 0;
          uVar6 = 0;
          do {
            uVar6 = uVar6 + *(short *)((long)next->_data + lVar7);
            lVar7 = lVar7 + 2;
          } while ((long)iVar3 * 2 != lVar7);
          fVar8 = (float)uVar6 * 0.5;
        }
        if ((float)*puVar2 < fVar8) goto LAB_0015bd03;
      }
      if ((((this->super_RowReader)._opts)->field_0x1 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_50,(ulong)&txt);
        std::__cxx11::string::operator=((string *)&txt,(string *)local_50);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
      }
      puVar4 = next->_base;
      if (puVar4 == next->_data + next->_size) {
        iVar3 = -1;
      }
      else {
        uVar6 = 0;
        do {
          uVar6 = uVar6 + *puVar4;
          puVar4 = puVar4 + 1;
        } while (puVar4 != next->_data + next->_size);
        iVar3 = uVar6 - 1;
      }
      paVar1 = &local_88._msg.field_2;
      local_88._msg.field_2._8_8_ = 0;
      local_88._msg._M_string_length = 0;
      local_88._msg.field_2._M_allocated_capacity = 0;
      local_88._file = (char *)0x0;
      local_88._line = -1;
      local_88._type = None;
      local_88._43_5_ = 0;
      local_88._msg._M_dataplus._M_p = (pointer)paVar1;
      Result::Result(__return_storage_ptr__,&txt,rowNumber,local_bc,iVar3,Codabar,
                     (SymbologyIdentifier)0x3046,&local_88,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._msg._M_dataplus._M_p != paVar1) {
        operator_delete(local_88._msg._M_dataplus._M_p,
                        local_88._msg.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0015bd1a;
    }
  }
LAB_0015bd03:
  memset(__return_storage_ptr__,0,0xd8);
  Result::Result(__return_storage_ptr__);
LAB_0015bd1a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)txt._M_dataplus._M_p != &txt.field_2) {
    operator_delete(txt._M_dataplus._M_p,
                    CONCAT44(txt.field_2._M_allocated_capacity._4_4_,
                             txt.field_2._M_allocated_capacity._0_4_) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Barcode CodabarReader::decodePattern(int rowNumber, PatternView& next, std::unique_ptr<DecodingState>&) const
{
	// minimal number of characters that must be present (including start, stop and checksum characters)
	// absolute minimum would be 2 (meaning 0 'content'). everything below 4 produces too many false
	// positives.
	const int minCharCount = 4;
	auto isStartOrStopSymbol = [](char c) { return 'A' <= c && c <= 'D'; };

	next = FindLeftGuard<CHAR_LEN>(next, minCharCount * CHAR_LEN, IsLeftGuard);
	if (!next.isValid())
		return {};

	int xStart = next.pixelsInFront();
	int maxInterCharacterSpace = next.sum() / 2; // spec actually says 1 narrow space, width/2 is about 4

	std::string txt;
	txt.reserve(20);
	txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET); // read off the start pattern

	if (!isStartOrStopSymbol(txt.back()))
		return {};

	do {
		// check remaining input width and inter-character space
		if (!next.skipSymbol() || !next.skipSingle(maxInterCharacterSpace))
			return {};

		txt += DecodeNarrowWidePattern(next, CHARACTER_ENCODINGS, ALPHABET);
		if (txt.back() == 0)
			return {};
	} while (!isStartOrStopSymbol(txt.back()));

	// next now points to the last decoded symbol
	// check txt length and whitespace after the last char. See also FindStartPattern.
	if (Size(txt) < minCharCount || !next.hasQuietZoneAfter(QUIET_ZONE_SCALE))
		return {};

	// remove stop/start characters
	if (!_opts.returnCodabarStartEnd())
		txt = txt.substr(1, txt.size() - 2);

	// symbology identifier ISO/IEC 15424:2008 4.4.9
	// if checksum processing were implemented and checksum present and stripped then modifier would be 4
	SymbologyIdentifier symbologyIdentifier = {'F', '0'};

	int xStop = next.pixelsTillEnd();
	return Barcode(txt, rowNumber, xStart, xStop, BarcodeFormat::Codabar, symbologyIdentifier);
}